

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O0

ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> ** __thiscall
Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::Register
          (ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *this,
          ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *cache)

{
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> **ppSVar1;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *cache_local;
  ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *this_local;
  
  ppSVar1 = DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>>*,RealCount>
            ::
            PrependNode<Memory::ArenaAllocator,Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>>*>
                      ((DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>>*,RealCount>
                        *)&this->scriptRegistrations,&this->arena,cache);
  return ppSVar1;
}

Assistant:

ScriptCacheRegistry<T>**
ThreadCacheRegistry<T>::Register(_In_ ScriptCacheRegistry<T>* cache)
{
    return this->scriptRegistrations.PrependNode(&this->arena, cache);
}